

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O2

int pmain(lua_State *L)

{
  char cVar1;
  int argc;
  int iVar2;
  int status;
  uint uVar3;
  char **argv;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  int args;
  long lVar7;
  int script;
  uint local_4c;
  
  uVar3 = 0;
  script = 1;
  argc = lua_tointegerx(L,1,0);
  argv = (char **)lua_touserdata(L,2);
  local_4c = 1;
LAB_001025ea:
  pcVar4 = argv[script];
  uVar6 = uVar3;
  if ((pcVar4 == (char *)0x0) || (*pcVar4 != '-')) goto LAB_00102682;
  cVar1 = pcVar4[1];
  if (cVar1 == 'E') {
    uVar6 = local_4c;
    if (pcVar4[2] != '\0') goto LAB_00102682;
    uVar3 = uVar3 | 0x10;
    goto LAB_00102656;
  }
  if (cVar1 == 'e') {
    uVar3 = uVar3 | 8;
LAB_00102622:
    if (pcVar4[2] == '\0') {
      uVar6 = local_4c;
      if ((argv[(long)script + 1] == (char *)0x0) || (*argv[(long)script + 1] == '-'))
      goto LAB_00102682;
      script = script + 1;
    }
    goto LAB_00102656;
  }
  if (cVar1 == 'i') {
    uVar3 = uVar3 | 2;
  }
  else {
    if (cVar1 == 'l') goto LAB_00102622;
    if (cVar1 != 'v') {
      if ((cVar1 != '\0') && (uVar6 = 1, cVar1 == '-')) {
        uVar6 = 1;
        if (pcVar4[2] == '\0') {
          uVar6 = uVar3;
        }
        script = script + (uint)(pcVar4[2] == '\0');
      }
LAB_00102682:
      local_4c = uVar6;
      luaL_checkversion_(0x407f700000000000,L,0x88);
      pcVar4 = *argv;
      if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
        progname = pcVar4;
      }
      if (local_4c == 1) {
        pcVar4 = argv[script];
        ravi_writestringerror(L,"%s: ",progname);
        cVar1 = pcVar4[1];
        pcVar5 = "unrecognized option \'%s\'\n";
        if (cVar1 == 'l') {
          pcVar5 = "\'%s\' needs argument\n";
        }
        if (cVar1 == 'e') {
          pcVar5 = "\'%s\' needs argument\n";
        }
        ravi_writestringerror(L,pcVar5,pcVar4);
        ravi_writestringerror
                  (L,
                   "usage: %s [options] [script [args]]\nAvailable options are:\n  -e stat  execute string \'stat\'\n  -i       enter interactive mode after executing \'script\'\n  -l name  require library \'name\' into global \'name\'\n  -v       show version information\n  -E       ignore environment variables\n  --       stop handling options\n  -        stop handling options and execute stdin\n"
                   ,progname);
        return 0;
      }
      if ((local_4c & 4) != 0) {
        print_version(L);
      }
      if ((local_4c & 0x10) == 0) {
        luaL_openlibs(L);
        luaL_requiref(L,"T",luaB_opentests,1);
        lua_settop(L,0xfffffffffffffffe);
        createargtable(L,argv,argc,script);
        pcVar4 = getenv("LUA_INIT_5_3");
        if (pcVar4 == (char *)0x0) {
          pcVar4 = getenv("LUA_INIT");
          if (pcVar4 == (char *)0x0) goto LAB_0010283d;
          pcVar5 = "=LUA_INIT";
        }
        else {
          pcVar5 = "=LUA_INIT_5_3";
        }
        if (*pcVar4 == '@') {
          iVar2 = luaL_loadfilex(L,pcVar4 + 1,0);
          iVar2 = dochunk(L,iVar2);
        }
        else {
          iVar2 = dostring(L,pcVar4,pcVar5);
        }
        if (iVar2 != 0) {
          return 0;
        }
      }
      else {
        lua_pushboolean(L,1);
        lua_setfield(L,0xfff0b9d8,"LUA_NOENV");
        luaL_openlibs(L);
        luaL_requiref(L,"T",luaB_opentests,1);
        lua_settop(L,0xfffffffffffffffe);
        createargtable(L,argv,argc,script);
      }
LAB_0010283d:
      for (iVar2 = 1; iVar2 < script; iVar2 = iVar2 + 1) {
        pcVar4 = argv[iVar2];
        if (*pcVar4 != '-') {
          __assert_fail("argv[i][0] == \'-\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lua.c"
                        ,0x20c,"int runargs(lua_State *, char **, int)");
        }
        cVar1 = pcVar4[1];
        if ((cVar1 == 'l') || (cVar1 == 'e')) {
          if (pcVar4[2] == '\0') {
            pcVar4 = argv[(long)iVar2 + 1];
            if (pcVar4 == (char *)0x0) {
              __assert_fail("extra != ((void*)0)",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lua.c"
                            ,0x211,"int runargs(lua_State *, char **, int)");
            }
            iVar2 = iVar2 + 1;
          }
          else {
            pcVar4 = pcVar4 + 2;
          }
          if (cVar1 == 'e') {
            status = dostring(L,pcVar4,"=(command line)");
          }
          else {
            lua_getglobal(L,"require");
            lua_pushstring(L,pcVar4);
            status = docall(L,1,1);
            if (status == 0) {
              lua_setglobal(L,pcVar4);
            }
            report(L,status);
          }
          if (status != 0) {
            return 0;
          }
        }
      }
      if (script < argc) {
        pcVar4 = argv[script];
        if ((*pcVar4 == '-') && (pcVar4[1] == '\0')) {
          pcVar5 = argv[(long)script + -1];
          if ((*pcVar5 == '-') && (pcVar5[1] == '-')) {
            if (pcVar5[2] != '\0') {
              pcVar4 = (char *)0x0;
            }
          }
          else {
            pcVar4 = (char *)0x0;
          }
        }
        iVar2 = luaL_loadfilex(L,pcVar4,0);
        if (iVar2 == 0) {
          iVar2 = lua_getglobal(L,"arg");
          if (iVar2 != 5) {
            luaL_error(L,"\'arg\' is not a table");
          }
          iVar2 = -1;
          uVar3 = luaL_len(L,0xffffffff);
          luaL_checkstack(L,uVar3 + 3,"too many arguments to script");
          uVar6 = ~((int)uVar3 >> 0x1f) & uVar3;
          for (lVar7 = 1; lVar7 - (ulong)uVar6 != 1; lVar7 = lVar7 + 1) {
            lua_rawgeti(L,iVar2,lVar7);
            iVar2 = iVar2 + -1;
          }
          lua_rotate(L,~uVar6,0xffffffff);
          lua_settop(L,0xfffffffffffffffe);
          iVar2 = docall(L,uVar3,-1);
        }
        report(L,iVar2);
        if (iVar2 != 0) {
          return 0;
        }
      }
      if ((local_4c & 2) == 0) {
        if ((script != argc) || ((local_4c & 0xc) != 0)) goto LAB_00102a36;
        print_version(L);
      }
      doREPL(L);
LAB_00102a36:
      lua_pushboolean(L,1);
      return 1;
    }
  }
  uVar6 = local_4c;
  if (pcVar4[2] != '\0') goto LAB_00102682;
  uVar3 = uVar3 | 4;
LAB_00102656:
  script = script + 1;
  goto LAB_001025ea;
}

Assistant:

static int pmain (lua_State *L) {
  int argc = (int)lua_tointeger(L, 1);
  char **argv = (char **)lua_touserdata(L, 2);
  int script;
  int args = collectargs(argv, &script);
  luaL_checkversion(L);  /* check that interpreter has correct version */
  if (argv[0] && argv[0][0]) progname = argv[0];
  if (args == has_error) {  /* bad arg? */
    print_usage(L, argv[script]);  /* 'script' has index of bad arg. */
    return 0;
  }
  if (args & has_v)  /* option '-v'? */
    print_version(L);
  if (args & has_E) {  /* option '-E'? */
    lua_pushboolean(L, 1);  /* signal for libraries to ignore env. vars. */
    lua_setfield(L, LUA_REGISTRYINDEX, "LUA_NOENV");
  }
  luaL_openlibs(L);  /* open standard libraries */
  createargtable(L, argv, argc, script);  /* create table 'arg' */
  //lua_gc(L, LUA_GCGEN, 0, 0);  /* GC in generational mode */
  if (!(args & has_E)) {  /* no option '-E'? */
    if (handle_luainit(L) != LUA_OK)  /* run LUA_INIT */
      return 0;  /* error running LUA_INIT */
  }
  if (!runargs(L, argv, script))  /* execute arguments -e and -l */
    return 0;  /* something failed */
  if (script < argc &&  /* execute main script (if there is one) */
      handle_script(L, argv + script) != LUA_OK)
    return 0;
  if (args & has_i)  /* -i option? */
    doREPL(L);  /* do read-eval-print loop */
  else if (script == argc && !(args & (has_e | has_v))) {  /* no arguments? */
    if (lua_stdin_is_tty()) {  /* running in interactive mode? */
      print_version(L);
      doREPL(L);  /* do read-eval-print loop */
    }
    else dofile(L, NULL);  /* executes stdin as a file */
  }
  lua_pushboolean(L, 1);  /* signal no errors */
  return 1;
}